

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_x86.cpp
# Opt level: O1

int __thiscall
ncnn::Padding_x86::forward(Padding_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long lVar1;
  int iVar2;
  int iVar3;
  uint _c;
  int iVar4;
  uint uVar5;
  _func_int *p_Var6;
  size_t sVar7;
  _func_int **pp_Var8;
  int *piVar9;
  bool bVar10;
  undefined8 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined1 uVar15;
  undefined1 uVar17;
  undefined1 uVar19;
  undefined1 uVar21;
  undefined4 uVar22;
  undefined1 uVar23;
  undefined1 uVar25;
  undefined1 uVar27;
  undefined1 uVar29;
  undefined1 uVar30;
  undefined1 uVar31;
  undefined1 uVar33;
  undefined1 uVar35;
  int iVar36;
  uint uVar37;
  int iVar38;
  ulong uVar39;
  int iVar40;
  ulong uVar41;
  undefined4 *puVar42;
  long lVar43;
  undefined8 *puVar44;
  int unaff_EBP;
  ulong uVar45;
  undefined8 *puVar46;
  undefined8 *puVar47;
  int iVar48;
  undefined4 *puVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  undefined4 *puVar54;
  int iVar55;
  ulong uVar56;
  ulong uVar57;
  bool bVar58;
  undefined4 uVar59;
  undefined4 uVar60;
  undefined4 uVar61;
  undefined4 uVar62;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  __m128 v;
  __m128 v_00;
  __m128 v_01;
  __m128 v_02;
  Mat m_1;
  Mat m;
  undefined4 uVar16;
  undefined3 uVar18;
  undefined2 uVar20;
  undefined4 uVar24;
  undefined3 uVar26;
  undefined2 uVar28;
  undefined3 uVar32;
  undefined2 uVar34;
  
  p_Var6 = this->_vptr_Padding_x86[-3];
  if (((((*(int *)(&this->field_0xd0 + (long)p_Var6) == 0) &&
        (*(int *)(&this->field_0xd4 + (long)p_Var6) == 0)) &&
       (*(int *)(&this->field_0xd8 + (long)p_Var6) == 0)) &&
      ((*(int *)(&this->field_0xdc + (long)p_Var6) == 0 &&
       (*(int *)(&this->field_0xe8 + (long)p_Var6) == 0)))) &&
     (*(int *)(&this->field_0xec + (long)p_Var6) == 0)) {
    Mat::operator=(top_blob,bottom_blob);
    iVar36 = 0;
  }
  else {
    iVar36 = bottom_blob->elempack;
    if ((iVar36 != 0) && (((int)bottom_blob->elemsize << 3) / iVar36 == 8)) {
      iVar36 = forward_int8(this,bottom_blob,top_blob,opt);
      return iVar36;
    }
    if (iVar36 == 4) {
      iVar40 = bottom_blob->w;
      iVar2 = bottom_blob->h;
      iVar3 = bottom_blob->d;
      _c = bottom_blob->c;
      iVar4 = bottom_blob->dims;
      uVar45 = bottom_blob->elemsize;
      if (iVar4 == 1) {
        uVar37 = *(uint *)(&this->field_0xd8 + (long)p_Var6) + iVar40 * 4 +
                 *(int *)(&this->field_0xdc + (long)p_Var6);
        bVar58 = (uVar37 & 3) == 0;
        bVar10 = true;
        if (((*(uint *)(&this->field_0xd8 + (long)p_Var6) & 3) == 0 && bVar58) &&
           (*(int *)(&this->field_0xe0 + (long)p_Var6) == 0)) {
          iVar38 = (uint)bVar58 * 3 + 1;
          Mat::create(top_blob,(int)uVar37 / iVar38,(uVar45 >> 2) << bVar58 * '\x02',iVar38,
                      opt->blob_allocator);
          unaff_EBP = -100;
          if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
            p_Var6 = this->_vptr_Padding_x86[-3];
            iVar38 = *(int *)(&this->field_0xd8 + (long)p_Var6);
            iVar50 = *(int *)(&this->field_0xdc + (long)p_Var6);
            iVar48 = iVar38 + 3;
            if (-1 < iVar38) {
              iVar48 = iVar38;
            }
            iVar38 = iVar50 + 3;
            if (-1 < iVar50) {
              iVar38 = iVar50;
            }
            v[1] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var6);
            v[0] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var6);
            v[3] = (float)in_XMM1_Db;
            v[2] = (float)in_XMM1_Da;
            padding_constant_pack4_sse(bottom_blob,top_blob,0,0,iVar48 >> 2,iVar38 >> 2,v);
            unaff_EBP = 0;
          }
          bVar10 = false;
        }
        if (!bVar10) {
          return unaff_EBP;
        }
      }
      if (iVar4 == 2) {
        p_Var6 = this->_vptr_Padding_x86[-3];
        uVar37 = *(uint *)(&this->field_0xd0 + (long)p_Var6) + iVar2 * 4 +
                 *(int *)(&this->field_0xd4 + (long)p_Var6);
        bVar58 = (uVar37 & 3) == 0;
        bVar10 = true;
        if (((*(uint *)(&this->field_0xd0 + (long)p_Var6) & 3) == 0 && bVar58) &&
           (*(int *)(&this->field_0xe0 + (long)p_Var6) == 0)) {
          iVar38 = (uint)bVar58 * 3 + 1;
          Mat::create(top_blob,*(int *)(&this->field_0xd8 + (long)p_Var6) + iVar40 +
                               *(int *)(&this->field_0xdc + (long)p_Var6),(int)uVar37 / iVar38,
                      (uVar45 >> 2) << bVar58 * '\x02',iVar38,opt->blob_allocator);
          unaff_EBP = -100;
          if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
            p_Var6 = this->_vptr_Padding_x86[-3];
            iVar38 = *(int *)(&this->field_0xd0 + (long)p_Var6);
            iVar50 = *(int *)(&this->field_0xd4 + (long)p_Var6);
            iVar48 = iVar38 + 3;
            if (-1 < iVar38) {
              iVar48 = iVar38;
            }
            iVar38 = iVar50 + 3;
            if (-1 < iVar50) {
              iVar38 = iVar50;
            }
            v_00[1] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var6);
            v_00[0] = (float)*(undefined4 *)(&this->field_0xe4 + (long)p_Var6);
            v_00[3] = (float)in_XMM1_Db;
            v_00[2] = (float)in_XMM1_Da;
            padding_constant_pack4_sse
                      (bottom_blob,top_blob,iVar48 >> 2,iVar38 >> 2,
                       *(int *)(&this->field_0xd8 + (long)p_Var6),
                       *(int *)(&this->field_0xdc + (long)p_Var6),v_00);
            unaff_EBP = 0;
          }
          bVar10 = false;
        }
        if (!bVar10) {
          return unaff_EBP;
        }
      }
      if (iVar4 == 3) {
        p_Var6 = this->_vptr_Padding_x86[-3];
        uVar37 = *(uint *)(&this->field_0xe8 + (long)p_Var6) + _c * 4 +
                 *(int *)(&this->field_0xec + (long)p_Var6);
        bVar58 = (uVar37 & 3) == 0;
        bVar10 = true;
        if ((*(uint *)(&this->field_0xe8 + (long)p_Var6) & 3) == 0 && bVar58) {
          if ((uVar37 == _c * 4) || (*(int *)(&this->field_0xe0 + (long)p_Var6) == 0)) {
            iVar50 = (uint)bVar58 * 3 + 1;
            uVar56 = (long)(int)uVar37 / (long)iVar50;
            iVar38 = (int)uVar56;
            Mat::create(top_blob,*(int *)(&this->field_0xd8 + (long)p_Var6) + iVar40 +
                                 *(int *)(&this->field_0xdc + (long)p_Var6),
                        *(int *)(&this->field_0xd0 + (long)p_Var6) + iVar2 +
                        *(int *)(&this->field_0xd4 + (long)p_Var6),iVar38,
                        (uVar45 >> 2) << bVar58 * '\x02',iVar50,opt->blob_allocator);
            unaff_EBP = -100;
            if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
              iVar50 = *(int *)(&this->field_0xe8 + (long)this->_vptr_Padding_x86[-3]);
              iVar48 = iVar50 + 3;
              if (-1 < iVar50) {
                iVar48 = iVar50;
              }
              if (0 < iVar38) {
                uVar57 = 0;
                do {
                  if (top_blob->dims == 3) {
                    iVar38 = top_blob->w;
                    sVar7 = top_blob->elemsize;
                    m.data = (void *)(top_blob->cstep * uVar57 * sVar7 + (long)top_blob->data);
                    m.h = top_blob->h;
                    m.elempack = top_blob->elempack;
                    m.allocator = top_blob->allocator;
                    m.elemsize._0_4_ = (undefined4)sVar7;
                    m.elemsize._4_4_ = (undefined4)(sVar7 >> 0x20);
                    m.w = iVar38;
                    m.dims = 2;
                    m.c = 1;
                  }
                  else {
                    iVar38 = top_blob->w;
                    m.h = top_blob->h;
                    m.c = top_blob->d;
                    sVar7 = top_blob->elemsize;
                    m.data = (void *)(top_blob->cstep * uVar57 * sVar7 + (long)top_blob->data);
                    m.elempack = top_blob->elempack;
                    m.allocator = top_blob->allocator;
                    m.elemsize._0_4_ = (undefined4)sVar7;
                    m.elemsize._4_4_ = (undefined4)(sVar7 >> 0x20);
                    m.w = iVar38;
                    m.dims = 3;
                  }
                  m.d = 1;
                  m.refcount._4_4_ = 0;
                  m.refcount._0_4_ = 0;
                  m.cstep = (long)m.h * (long)iVar38;
                  p_Var6 = this->_vptr_Padding_x86[-3];
                  if (*(int *)(&this->field_0xf0 + (long)p_Var6) == 0) {
                    uVar59 = *(undefined4 *)(&this->field_0xe4 + (long)p_Var6);
                    uVar60 = uVar59;
                    uVar61 = uVar59;
                    uVar62 = uVar59;
                  }
                  else {
                    puVar49 = (undefined4 *)
                              (*(long *)(&this->field_0xf8 + (long)p_Var6) + uVar57 * 0x10);
                    uVar59 = *puVar49;
                    uVar60 = puVar49[1];
                    uVar61 = puVar49[2];
                    uVar62 = puVar49[3];
                  }
                  uVar37 = (int)uVar57 - (iVar48 >> 2);
                  if ((int)uVar37 < 0 || (int)_c <= (int)uVar37) {
                    if (0 < m.c * (int)m.cstep) {
                      lVar43 = 0;
                      do {
                        puVar49 = (undefined4 *)((long)m.data + lVar43);
                        *puVar49 = uVar59;
                        puVar49[1] = uVar60;
                        puVar49[2] = uVar61;
                        puVar49[3] = uVar62;
                        lVar43 = lVar43 + 0x10;
                      } while ((ulong)(uint)(m.c * (int)m.cstep) << 4 != lVar43);
                    }
                  }
                  else {
                    m_1.w = bottom_blob->w;
                    m_1.h = bottom_blob->h;
                    if (bottom_blob->dims == 3) {
                      sVar7 = bottom_blob->elemsize;
                      m_1.data = (void *)((ulong)uVar37 * bottom_blob->cstep * sVar7 +
                                         (long)bottom_blob->data);
                      m_1.elempack = bottom_blob->elempack;
                      m_1.allocator = bottom_blob->allocator;
                      m_1.elemsize._0_4_ = (undefined4)sVar7;
                      m_1.elemsize._4_4_ = (undefined4)(sVar7 >> 0x20);
                      m_1.dims = 2;
                      m_1.c = 1;
                    }
                    else {
                      m_1.c = bottom_blob->d;
                      sVar7 = bottom_blob->elemsize;
                      m_1.data = (void *)((ulong)uVar37 * bottom_blob->cstep * sVar7 +
                                         (long)bottom_blob->data);
                      m_1.elempack = bottom_blob->elempack;
                      m_1.allocator = bottom_blob->allocator;
                      m_1.elemsize._0_4_ = (undefined4)sVar7;
                      m_1.elemsize._4_4_ = (undefined4)(sVar7 >> 0x20);
                      m_1.dims = 3;
                    }
                    m_1.d = 1;
                    m_1.refcount._4_4_ = 0;
                    m_1.refcount._0_4_ = 0;
                    m_1.cstep = (long)m_1.h * (long)m_1.w;
                    p_Var6 = this->_vptr_Padding_x86[-3];
                    if (*(int *)(&this->field_0xe0 + (long)p_Var6) == 0) {
                      v_01[1] = (float)uVar60;
                      v_01[0] = (float)uVar59;
                      v_01[2] = 0.0;
                      v_01[3] = 0.0;
                      padding_constant_pack4_sse
                                (&m_1,&m,*(int *)(&this->field_0xd0 + (long)p_Var6),
                                 *(int *)(&this->field_0xd4 + (long)p_Var6),
                                 *(int *)(&this->field_0xd8 + (long)p_Var6),
                                 *(int *)(&this->field_0xdc + (long)p_Var6),v_01);
                    }
                    pp_Var8 = this->_vptr_Padding_x86;
                    p_Var6 = pp_Var8[-3];
                    if (*(int *)(&this->field_0xe0 + (long)p_Var6) == 1) {
                      iVar38 = *(int *)(&this->field_0xd0 + (long)p_Var6);
                      iVar50 = *(int *)(&this->field_0xd4 + (long)p_Var6);
                      iVar53 = *(int *)(&this->field_0xd8 + (long)p_Var6);
                      iVar55 = *(int *)(&this->field_0xdc + (long)p_Var6);
                      puVar49 = (undefined4 *)m.data;
                      if (0 < iVar38) {
                        iVar51 = 0;
                        do {
                          uVar59 = *m_1.data;
                          uVar60 = *(undefined4 *)((long)m_1.data + 4);
                          uVar61 = *(undefined4 *)((long)m_1.data + 8);
                          uVar62 = *(undefined4 *)((long)m_1.data + 0xc);
                          iVar52 = iVar53;
                          if (0 < iVar53) {
                            do {
                              *puVar49 = uVar59;
                              puVar49[1] = uVar60;
                              puVar49[2] = uVar61;
                              puVar49[3] = uVar62;
                              puVar49 = puVar49 + 4;
                              iVar52 = iVar52 + -1;
                            } while (iVar52 != 0);
                          }
                          if (0 < m_1.w) {
                            iVar52 = 0;
                            puVar42 = (undefined4 *)m_1.data;
                            do {
                              uVar59 = *puVar42;
                              uVar60 = puVar42[1];
                              uVar61 = puVar42[2];
                              uVar62 = puVar42[3];
                              *puVar49 = uVar59;
                              puVar49[1] = uVar60;
                              puVar49[2] = uVar61;
                              puVar49[3] = uVar62;
                              puVar42 = puVar42 + 4;
                              puVar49 = puVar49 + 4;
                              iVar52 = iVar52 + 1;
                            } while (iVar52 < m_1.w);
                          }
                          iVar52 = iVar55;
                          if (0 < iVar55) {
                            do {
                              *puVar49 = uVar59;
                              puVar49[1] = uVar60;
                              puVar49[2] = uVar61;
                              puVar49[3] = uVar62;
                              puVar49 = puVar49 + 4;
                              iVar52 = iVar52 + -1;
                            } while (iVar52 != 0);
                          }
                          iVar51 = iVar51 + 1;
                        } while (iVar51 != iVar38);
                      }
                      puVar42 = (undefined4 *)m_1.data;
                      if (0 < m_1.h) {
                        iVar38 = 0;
                        do {
                          uVar59 = *puVar42;
                          uVar60 = puVar42[1];
                          uVar61 = puVar42[2];
                          uVar62 = puVar42[3];
                          iVar51 = iVar53;
                          if (0 < iVar53) {
                            do {
                              *puVar49 = uVar59;
                              puVar49[1] = uVar60;
                              puVar49[2] = uVar61;
                              puVar49[3] = uVar62;
                              puVar49 = puVar49 + 4;
                              iVar51 = iVar51 + -1;
                            } while (iVar51 != 0);
                          }
                          if (0 < m_1.w) {
                            iVar51 = 0;
                            do {
                              uVar59 = *puVar42;
                              uVar60 = puVar42[1];
                              uVar61 = puVar42[2];
                              uVar62 = puVar42[3];
                              *puVar49 = uVar59;
                              puVar49[1] = uVar60;
                              puVar49[2] = uVar61;
                              puVar49[3] = uVar62;
                              puVar42 = puVar42 + 4;
                              puVar49 = puVar49 + 4;
                              iVar51 = iVar51 + 1;
                            } while (iVar51 < m_1.w);
                          }
                          iVar51 = iVar55;
                          if (0 < iVar55) {
                            do {
                              *puVar49 = uVar59;
                              puVar49[1] = uVar60;
                              puVar49[2] = uVar61;
                              puVar49[3] = uVar62;
                              puVar49 = puVar49 + 4;
                              iVar51 = iVar51 + -1;
                            } while (iVar51 != 0);
                          }
                          iVar38 = iVar38 + 1;
                        } while (iVar38 < m_1.h);
                      }
                      if (0 < iVar50) {
                        puVar42 = puVar42 + (long)m_1.w * -4;
                        iVar38 = 0;
                        do {
                          uVar59 = *puVar42;
                          uVar60 = puVar42[1];
                          uVar61 = puVar42[2];
                          uVar62 = puVar42[3];
                          iVar51 = iVar53;
                          if (0 < iVar53) {
                            do {
                              *puVar49 = uVar59;
                              puVar49[1] = uVar60;
                              puVar49[2] = uVar61;
                              puVar49[3] = uVar62;
                              puVar49 = puVar49 + 4;
                              iVar51 = iVar51 + -1;
                            } while (iVar51 != 0);
                          }
                          if (0 < m_1.w) {
                            iVar51 = 0;
                            puVar54 = puVar42;
                            do {
                              uVar59 = *puVar54;
                              uVar60 = puVar54[1];
                              uVar61 = puVar54[2];
                              uVar62 = puVar54[3];
                              *puVar49 = uVar59;
                              puVar49[1] = uVar60;
                              puVar49[2] = uVar61;
                              puVar49[3] = uVar62;
                              puVar54 = puVar54 + 4;
                              puVar49 = puVar49 + 4;
                              iVar51 = iVar51 + 1;
                            } while (iVar51 < m_1.w);
                          }
                          iVar51 = iVar55;
                          if (0 < iVar55) {
                            do {
                              *puVar49 = uVar59;
                              puVar49[1] = uVar60;
                              puVar49[2] = uVar61;
                              puVar49[3] = uVar62;
                              puVar49 = puVar49 + 4;
                              iVar51 = iVar51 + -1;
                            } while (iVar51 != 0);
                          }
                          iVar38 = iVar38 + 1;
                        } while (iVar38 != iVar50);
                      }
                    }
                    p_Var6 = pp_Var8[-3];
                    if (*(int *)(&this->field_0xe0 + (long)p_Var6) == 2) {
                      iVar38 = *(int *)(&this->field_0xd0 + (long)p_Var6);
                      iVar50 = *(int *)(&this->field_0xd4 + (long)p_Var6);
                      uVar37 = *(uint *)(&this->field_0xd8 + (long)p_Var6);
                      uVar39 = (ulong)uVar37;
                      uVar5 = *(uint *)(&this->field_0xdc + (long)p_Var6);
                      uVar41 = (ulong)uVar5;
                      puVar47 = (undefined8 *)((long)(m_1.w * iVar38 * 4) * 4 + (long)m_1.data);
                      puVar46 = (undefined8 *)m.data;
                      if (0 < iVar38) {
                        iVar53 = 0;
                        do {
                          lVar43 = uVar39 << 4;
                          if (0 < (int)uVar37) {
                            do {
                              uVar11 = ((undefined8 *)((long)puVar47 + lVar43))[1];
                              *puVar46 = *(undefined8 *)((long)puVar47 + lVar43);
                              puVar46[1] = uVar11;
                              puVar46 = puVar46 + 2;
                              lVar43 = lVar43 + -0x10;
                            } while (lVar43 != 0);
                          }
                          puVar44 = puVar47;
                          if (0 < m_1.w) {
                            iVar55 = 0;
                            do {
                              uVar11 = puVar44[1];
                              *puVar46 = *puVar44;
                              puVar46[1] = uVar11;
                              puVar44 = puVar44 + 2;
                              puVar46 = puVar46 + 2;
                              iVar55 = iVar55 + 1;
                            } while (iVar55 < m_1.w);
                          }
                          if (0 < (int)uVar5) {
                            lVar43 = -0x20;
                            do {
                              uVar11 = ((undefined8 *)((long)puVar44 + lVar43))[1];
                              *puVar46 = *(undefined8 *)((long)puVar44 + lVar43);
                              puVar46[1] = uVar11;
                              puVar46 = puVar46 + 2;
                              lVar1 = uVar41 * 0x10 + lVar43;
                              lVar43 = lVar43 + -0x10;
                            } while (lVar1 != -0x10);
                          }
                          puVar47 = puVar47 + (long)m_1.w * -2;
                          iVar53 = iVar53 + 1;
                        } while (iVar53 != iVar38);
                      }
                      if (0 < m_1.h) {
                        iVar38 = 0;
                        do {
                          lVar43 = uVar39 << 4;
                          if (0 < (int)uVar37) {
                            do {
                              uVar11 = ((undefined8 *)((long)puVar47 + lVar43))[1];
                              *puVar46 = *(undefined8 *)((long)puVar47 + lVar43);
                              puVar46[1] = uVar11;
                              puVar46 = puVar46 + 2;
                              lVar43 = lVar43 + -0x10;
                            } while (lVar43 != 0);
                          }
                          if (0 < m_1.w) {
                            iVar53 = 0;
                            do {
                              uVar11 = puVar47[1];
                              *puVar46 = *puVar47;
                              puVar46[1] = uVar11;
                              puVar47 = puVar47 + 2;
                              puVar46 = puVar46 + 2;
                              iVar53 = iVar53 + 1;
                            } while (iVar53 < m_1.w);
                          }
                          if (0 < (int)uVar5) {
                            lVar43 = -0x20;
                            do {
                              uVar11 = ((undefined8 *)((long)puVar47 + lVar43))[1];
                              *puVar46 = *(undefined8 *)((long)puVar47 + lVar43);
                              puVar46[1] = uVar11;
                              puVar46 = puVar46 + 2;
                              lVar1 = uVar41 * 0x10 + lVar43;
                              lVar43 = lVar43 + -0x10;
                            } while (lVar1 != -0x10);
                          }
                          iVar38 = iVar38 + 1;
                        } while (iVar38 < m_1.h);
                      }
                      if (0 < iVar50) {
                        puVar47 = puVar47 + (long)m_1.w * -4;
                        iVar38 = 0;
                        do {
                          lVar43 = uVar39 << 4;
                          if (0 < (int)uVar37) {
                            do {
                              uVar11 = ((undefined8 *)((long)puVar47 + lVar43))[1];
                              *puVar46 = *(undefined8 *)((long)puVar47 + lVar43);
                              puVar46[1] = uVar11;
                              puVar46 = puVar46 + 2;
                              lVar43 = lVar43 + -0x10;
                            } while (lVar43 != 0);
                          }
                          puVar44 = puVar47;
                          if (0 < m_1.w) {
                            iVar53 = 0;
                            do {
                              uVar11 = puVar44[1];
                              *puVar46 = *puVar44;
                              puVar46[1] = uVar11;
                              puVar44 = puVar44 + 2;
                              puVar46 = puVar46 + 2;
                              iVar53 = iVar53 + 1;
                            } while (iVar53 < m_1.w);
                          }
                          if (0 < (int)uVar5) {
                            lVar43 = -0x20;
                            do {
                              uVar11 = ((undefined8 *)((long)puVar44 + lVar43))[1];
                              *puVar46 = *(undefined8 *)((long)puVar44 + lVar43);
                              puVar46[1] = uVar11;
                              puVar46 = puVar46 + 2;
                              lVar1 = uVar41 * 0x10 + lVar43;
                              lVar43 = lVar43 + -0x10;
                            } while (lVar1 != -0x10);
                          }
                          puVar47 = puVar47 + (long)m_1.w * -2;
                          iVar38 = iVar38 + 1;
                        } while (iVar38 != iVar50);
                      }
                    }
                    piVar9 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                    if (piVar9 != (int *)0x0) {
                      LOCK();
                      *piVar9 = *piVar9 + -1;
                      UNLOCK();
                      if (*piVar9 == 0) {
                        if (m_1.allocator == (Allocator *)0x0) {
                          if (m_1.data != (void *)0x0) {
                            free(m_1.data);
                          }
                        }
                        else {
                          (*(m_1.allocator)->_vptr_Allocator[3])();
                        }
                      }
                    }
                    m_1.cstep = 0;
                    m_1.data = (void *)0x0;
                    m_1.refcount._0_4_ = 0;
                    m_1.refcount._4_4_ = 0;
                    m_1.elemsize._0_4_ = 0;
                    m_1.elemsize._4_4_ = 0;
                    m_1.elempack = 0;
                    m_1.dims = 0;
                    m_1.w = 0;
                    m_1.h = 0;
                    m_1.d = 0;
                    m_1.c = 0;
                  }
                  piVar9 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
                  if (piVar9 != (int *)0x0) {
                    LOCK();
                    *piVar9 = *piVar9 + -1;
                    UNLOCK();
                    if (*piVar9 == 0) {
                      if (m.allocator == (Allocator *)0x0) {
                        if (m.data != (void *)0x0) {
                          free(m.data);
                        }
                      }
                      else {
                        (*(m.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  in_XMM1_Db = 0;
                  in_XMM1_Da = 0;
                  m.cstep = 0;
                  m.data = (void *)0x0;
                  m.refcount._0_4_ = 0;
                  m.refcount._4_4_ = 0;
                  m.elemsize._0_4_ = 0;
                  m.elemsize._4_4_ = 0;
                  m.elempack = 0;
                  m.dims = 0;
                  m.w = 0;
                  m.h = 0;
                  m.d = 0;
                  m.c = 0;
                  uVar57 = uVar57 + 1;
                } while (uVar57 != (uVar56 & 0xffffffff));
              }
              unaff_EBP = 0;
            }
            bVar10 = false;
          }
        }
        if (!bVar10) {
          return unaff_EBP;
        }
      }
      if (iVar4 == 4) {
        p_Var6 = this->_vptr_Padding_x86[-3];
        iVar4 = *(int *)(&this->field_0xe0 + (long)p_Var6);
        if (iVar4 == 0) {
          uVar37 = *(int *)(&this->field_0xe8 + (long)p_Var6) + iVar3 +
                   *(int *)(&this->field_0xec + (long)p_Var6);
          Mat::create(top_blob,iVar40 + *(int *)(&this->field_0xd8 + (long)p_Var6) +
                               *(int *)(&this->field_0xdc + (long)p_Var6),
                      iVar2 + *(int *)(&this->field_0xd0 + (long)p_Var6) +
                      *(int *)(&this->field_0xd4 + (long)p_Var6),uVar37,_c,uVar45,4,
                      opt->blob_allocator);
          unaff_EBP = -100;
          if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
            if ((int)_c < 1) {
              unaff_EBP = 0;
            }
            else {
              uVar45 = 0;
              do {
                p_Var6 = this->_vptr_Padding_x86[-3];
                if (*(int *)(&this->field_0xf0 + (long)p_Var6) == 0) {
                  uVar59 = *(undefined4 *)(&this->field_0xe4 + (long)p_Var6);
                  uVar60 = uVar59;
                  uVar61 = uVar59;
                  uVar62 = uVar59;
                }
                else {
                  puVar49 = (undefined4 *)
                            (*(long *)(&this->field_0xf8 + (long)p_Var6) + uVar45 * 0x10);
                  uVar59 = *puVar49;
                  uVar60 = puVar49[1];
                  uVar61 = puVar49[2];
                  uVar62 = puVar49[3];
                }
                if (0 < (int)uVar37) {
                  uVar56 = 0;
                  do {
                    sVar7 = top_blob->elemsize;
                    m.elempack = top_blob->elempack;
                    m.allocator = top_blob->allocator;
                    m.h = top_blob->h;
                    m.cstep = (long)m.h * (long)top_blob->w;
                    m.data = (void *)((long)top_blob->data +
                                     uVar56 * sVar7 * m.cstep + top_blob->cstep * uVar45 * sVar7);
                    m.refcount._0_4_ = 0;
                    m.refcount._4_4_ = 0;
                    m.elemsize._0_4_ = (undefined4)sVar7;
                    m.elemsize._4_4_ = (undefined4)(sVar7 >> 0x20);
                    m.w = top_blob->w;
                    m.dims = 2;
                    m.d = 1;
                    m.c = 1;
                    iVar40 = (int)uVar56 -
                             *(int *)(&this->field_0xe8 + (long)this->_vptr_Padding_x86[-3]);
                    if (iVar40 < 0 || iVar3 <= iVar40) {
                      if (0 < (int)m.cstep) {
                        lVar43 = 0;
                        do {
                          puVar49 = (undefined4 *)((long)m.data + lVar43);
                          *puVar49 = uVar59;
                          puVar49[1] = uVar60;
                          puVar49[2] = uVar61;
                          puVar49[3] = uVar62;
                          lVar43 = lVar43 + 0x10;
                        } while ((m.cstep & 0xffffffff) << 4 != lVar43);
                      }
                    }
                    else {
                      sVar7 = bottom_blob->elemsize;
                      m_1.elempack = bottom_blob->elempack;
                      m_1.allocator = bottom_blob->allocator;
                      m_1.h = bottom_blob->h;
                      m_1.cstep = (long)m_1.h * (long)bottom_blob->w;
                      m_1.data = (void *)((long)bottom_blob->data +
                                         m_1.cstep * sVar7 *
                                         ((long)(int)uVar56 -
                                         (long)*(int *)(&this->field_0xe8 +
                                                       (long)this->_vptr_Padding_x86[-3])) +
                                         bottom_blob->cstep * uVar45 * sVar7);
                      m_1.refcount._0_4_ = 0;
                      m_1.refcount._4_4_ = 0;
                      m_1.elemsize._0_4_ = (undefined4)sVar7;
                      m_1.elemsize._4_4_ = (undefined4)(sVar7 >> 0x20);
                      m_1.w = bottom_blob->w;
                      m_1.dims = 2;
                      m_1.d = 1;
                      m_1.c = 1;
                      p_Var6 = this->_vptr_Padding_x86[-3];
                      v_02[1] = (float)uVar60;
                      v_02[0] = (float)uVar59;
                      v_02[3] = (float)in_XMM1_Db;
                      v_02[2] = (float)in_XMM1_Da;
                      padding_constant_pack4_sse
                                (&m_1,&m,*(int *)(&this->field_0xd0 + (long)p_Var6),
                                 *(int *)(&this->field_0xd4 + (long)p_Var6),
                                 *(int *)(&this->field_0xd8 + (long)p_Var6),
                                 *(int *)(&this->field_0xdc + (long)p_Var6),v_02);
                      piVar9 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                      if (piVar9 != (int *)0x0) {
                        LOCK();
                        *piVar9 = *piVar9 + -1;
                        UNLOCK();
                        if (*piVar9 == 0) {
                          if (m_1.allocator == (Allocator *)0x0) {
                            if (m_1.data != (void *)0x0) {
                              free(m_1.data);
                            }
                          }
                          else {
                            (*(m_1.allocator)->_vptr_Allocator[3])();
                          }
                        }
                      }
                      m_1.cstep = 0;
                      m_1.data = (void *)0x0;
                      m_1.refcount._0_4_ = 0;
                      m_1.refcount._4_4_ = 0;
                      m_1.elemsize._0_4_ = 0;
                      m_1.elemsize._4_4_ = 0;
                      m_1.elempack = 0;
                      m_1.dims = 0;
                      m_1.w = 0;
                      m_1.h = 0;
                      m_1.d = 0;
                      m_1.c = 0;
                    }
                    piVar9 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
                    if (piVar9 != (int *)0x0) {
                      LOCK();
                      *piVar9 = *piVar9 + -1;
                      UNLOCK();
                      if (*piVar9 == 0) {
                        if (m.allocator == (Allocator *)0x0) {
                          if (m.data != (void *)0x0) {
                            free(m.data);
                          }
                        }
                        else {
                          (*(m.allocator)->_vptr_Allocator[3])();
                        }
                      }
                    }
                    in_XMM1_Da = 0;
                    in_XMM1_Db = 0;
                    uVar56 = uVar56 + 1;
                  } while (uVar56 != uVar37);
                }
                uVar45 = uVar45 + 1;
              } while (uVar45 != _c);
              unaff_EBP = 0;
            }
          }
        }
        if (iVar4 == 0) {
          return unaff_EBP;
        }
      }
    }
    m.data = bottom_blob->data;
    piVar9 = bottom_blob->refcount;
    m.refcount._0_4_ = SUB84(piVar9,0);
    m.refcount._4_4_ = (undefined4)((ulong)piVar9 >> 0x20);
    m.elemsize._0_4_ = (undefined4)bottom_blob->elemsize;
    m.elemsize._4_4_ = (undefined4)(bottom_blob->elemsize >> 0x20);
    m.elempack = bottom_blob->elempack;
    m.allocator = bottom_blob->allocator;
    m.dims = bottom_blob->dims;
    m.w = bottom_blob->w;
    uVar12 = bottom_blob->h;
    uVar13 = bottom_blob->d;
    m.c = bottom_blob->c;
    m.cstep = bottom_blob->cstep;
    if (piVar9 != (int *)0x0) {
      LOCK();
      *piVar9 = *piVar9 + 1;
      UNLOCK();
    }
    m.h = uVar12;
    m.d = uVar13;
    if (iVar36 != 1) {
      m_1.data = *(void **)opt;
      uVar14 = opt->openmp_blocktime;
      uVar15 = opt->use_winograd_convolution;
      uVar17 = opt->use_sgemm_convolution;
      uVar19 = opt->use_int8_inference;
      uVar21 = opt->use_vulkan_compute;
      uVar20 = CONCAT11(uVar21,uVar19);
      uVar18 = CONCAT21(uVar20,uVar17);
      uVar16 = CONCAT31(uVar18,uVar15);
      m_1.allocator = *(Allocator **)&opt->use_bf16_storage;
      m_1._40_8_ = *(undefined8 *)&opt->use_shader_pack8;
      uVar22 = opt->flush_denormals;
      uVar23 = opt->use_local_pool_allocator;
      uVar25 = opt->use_reserved_1;
      uVar27 = opt->use_reserved_2;
      uVar29 = opt->use_reserved_3;
      uVar28 = CONCAT11(uVar29,uVar27);
      uVar26 = CONCAT21(uVar28,uVar25);
      uVar24 = CONCAT31(uVar26,uVar23);
      uVar11._0_1_ = opt->use_reserved_4;
      uVar11._1_1_ = opt->use_reserved_5;
      uVar11._2_1_ = opt->use_reserved_6;
      uVar11._3_1_ = opt->use_reserved_7;
      uVar30 = opt->use_reserved_8;
      uVar31 = opt->use_reserved_9;
      uVar33 = opt->use_reserved_10;
      uVar35 = opt->use_reserved_11;
      uVar34 = CONCAT11(uVar35,uVar33);
      uVar32 = CONCAT21(uVar34,uVar31);
      uVar11._4_4_ = CONCAT31(uVar32,uVar30);
      m_1.c = (int)uVar11;
      m_1.elemsize._0_4_ = SUB84(opt->workspace_allocator,0);
      m_1.elemsize._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
      m_1.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
      m_1.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
      m_1.elempack = uVar14;
      m_1._28_4_ = uVar16;
      m_1.h = uVar22;
      m_1.d = uVar24;
      m_1._60_4_ = uVar11._4_4_;
      convert_packing(bottom_blob,&m,1,(Option *)&m_1);
    }
    iVar36 = Padding::forward((Padding *)
                              ((long)&this->_vptr_Padding_x86 + (long)this->_vptr_Padding_x86[-3]),
                              &m,top_blob,opt);
    piVar9 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar9 != (int *)0x0) {
      LOCK();
      *piVar9 = *piVar9 + -1;
      UNLOCK();
      if (*piVar9 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          if (m.data != (void *)0x0) {
            free(m.data);
          }
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  return iVar36;
}

Assistant:

int Padding_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (top == 0 && bottom == 0 && left == 0 && right == 0 && front == 0 && behind == 0)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int elembits = bottom_blob.elembits();

    if (elembits == 8)
        return forward_int8(bottom_blob, top_blob, opt);

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
#if __AVX__
    if (elempack == 8)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, 0, 0, left / 8, right / 8, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, top / 8, bottom / 8, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 8 == 0 && out_elempack == 8 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack8_avx(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack8_avx(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

#if __AVX__
            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outw % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, 0, 0, left / 4, right / 4, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

#if __AVX__
            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outh % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, top / 4, bottom / 4, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

#if __AVX__
            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 4 == 0 && out_elempack == 4 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack4_sse(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack4_sse(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    return Padding::forward(bottom_blob_unpacked, top_blob, opt);
}